

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

void it_send_midi(DUMB_IT_SIGRENDERER *sigrenderer,IT_CHANNEL *channel,uchar midi_byte)

{
  char cVar1;
  int iVar2;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  int i;
  int local_18;
  
  if ((*(long *)(*(long *)(in_RDI + 0x2e70) + 0x20) == 0) ||
     (iVar2 = (**(code **)(*(long *)(in_RDI + 0x2e70) + 0x20))
                        (*(undefined8 *)(*(long *)(in_RDI + 0x2e70) + 0x28),
                         (in_RSI - (in_RDI + 0x20)) / 0xa0 & 0xffffffff,in_DL), iVar2 == 0)) {
    cVar1 = *(char *)(in_RSI + 0x5f);
    if (cVar1 == '\x02') {
      if (in_DL == 0) {
        *(undefined1 *)(in_RSI + 0x5f) = 3;
      }
      else if (in_DL == 1) {
        *(undefined1 *)(in_RSI + 0x5f) = 4;
      }
      else {
        *(undefined1 *)(in_RSI + 0x5f) = 0;
      }
    }
    else if (cVar1 == '\x03') {
      if (in_DL < 0x80) {
        *(byte *)(in_RSI + 0x11) = in_DL;
      }
      *(undefined1 *)(in_RSI + 0x5f) = 0;
    }
    else if (cVar1 == '\x04') {
      if (in_DL < 0x80) {
        *(byte *)(in_RSI + 0x12) = in_DL;
      }
      *(undefined1 *)(in_RSI + 0x5f) = 0;
    }
    else {
      switch(in_DL) {
      case 0xf0:
        *(char *)(in_RSI + 0x5f) = *(char *)(in_RSI + 0x5f) + '\x01';
        break;
      case 0xfa:
      case 0xfc:
      case 0xff:
        for (local_18 = 0; local_18 < 0x40; local_18 = local_18 + 1) {
          *(undefined1 *)(in_RDI + (long)local_18 * 0xa0 + 0x31) = 0x7f;
          *(undefined1 *)(in_RDI + (long)local_18 * 0xa0 + 0x32) = 0;
        }
      default:
        *(undefined1 *)(in_RSI + 0x5f) = 0;
      }
    }
  }
  return;
}

Assistant:

static void it_send_midi(DUMB_IT_SIGRENDERER *sigrenderer, IT_CHANNEL *channel, unsigned char midi_byte)
{
	if (sigrenderer->callbacks->midi)
		if ((*sigrenderer->callbacks->midi)(sigrenderer->callbacks->midi_data, (int)(channel - sigrenderer->channel), midi_byte))
			return;

	switch (channel->midi_state) {
		case 4: /* Ready to receive resonance parameter */
			if (midi_byte < 0x80) channel->filter_resonance = midi_byte;
			channel->midi_state = 0;
			break;
		case 3: /* Ready to receive cutoff parameter */
			if (midi_byte < 0x80) channel->filter_cutoff = midi_byte;
			channel->midi_state = 0;
			break;
		case 2: /* Ready for byte specifying which parameter will follow */
			if (midi_byte == 0) /* Cutoff */
				channel->midi_state = 3;
			else if (midi_byte == 1) /* Resonance */
				channel->midi_state = 4;
			else
				channel->midi_state = 0;
			break;
		default: /* Counting initial F0 bytes */
			switch (midi_byte) {
				case 0xF0:
					channel->midi_state++;
					break;
				case 0xFA:
				case 0xFC:
				case 0xFF:
					/* Reset filter parameters for all channels */
					{
						int i;
						for (i = 0; i < DUMB_IT_N_CHANNELS; i++) {
							sigrenderer->channel[i].filter_cutoff = 127;
							sigrenderer->channel[i].filter_resonance = 0;
							//// should we be resetting channel[i].playing->filter_* here?
						}
					}
					/* Fall through */
				default:
					channel->midi_state = 0;
					break;
			}
	}
}